

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O0

bool YAML::IsNullString(string *str)

{
  byte bVar1;
  bool bVar2;
  char *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  bool bVar3;
  
  bVar1 = std::__cxx11::string::empty();
  bVar3 = true;
  if ((bVar1 & 1) == 0) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    bVar3 = true;
    if (!bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
      bVar3 = true;
      if (!bVar2) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
        bVar3 = true;
        if (!bVar2) {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8
                                 );
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool IsNullString(const std::string& str) {
  return str.empty() || str == "~" || str == "null" || str == "Null" ||
         str == "NULL";
}